

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool Catch::Internal::
     Evaluator<std::basic_string_view<char,_std::char_traits<char>_>,_char[1],_(Catch::Internal::Operator)0>
     ::evaluate(basic_string_view<char,_std::char_traits<char>_> *lhs,char (*rhs) [1])

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar1;
  basic_string_view<char,_std::char_traits<char>_> *pbVar2;
  char (*__str) [1];
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_38;
  size_t local_28;
  char *local_20;
  char (*local_18) [1];
  char (*rhs_local) [1];
  basic_string_view<char,_std::char_traits<char>_> *lhs_local;
  
  local_18 = rhs;
  rhs_local = (char (*) [1])lhs;
  pbVar2 = opCast<std::basic_string_view<char,std::char_traits<char>>>(lhs);
  local_28 = pbVar2->_M_len;
  local_20 = pbVar2->_M_str;
  __str = char(local_18);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_38,*__str);
  __x._M_str = local_20;
  __x._M_len = local_28;
  bVar1 = std::operator==(__x,local_38);
  return bVar1;
}

Assistant:

static bool evaluate( T1 const& lhs, T2 const& rhs) {
            return bool( opCast( lhs ) ==  opCast( rhs ) );
        }